

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O3

bool __thiscall
BamTools::Internal::BamReaderPrivate::LoadNextAlignment
          (BamReaderPrivate *this,BamAlignment *alignment)

{
  BgzfStream *this_00;
  pointer *ppCVar1;
  long lVar2;
  pointer pCVar3;
  iterator __position;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  CigarOp CVar27;
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  uint uVar31;
  uint uVar32;
  size_t sVar33;
  long lVar34;
  char *data;
  undefined8 unaff_RBP;
  ulong __n;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  char x [32];
  char buffer [4];
  CigarOp local_68;
  uint local_5c;
  undefined8 local_58;
  undefined4 local_50;
  undefined4 local_4c;
  uint32_t local_48;
  undefined8 local_44;
  int32_t local_3c;
  uint local_34;
  
  local_34 = 0;
  this_00 = &this->m_stream;
  BgzfStream::Read(this_00,(char *)&local_34,4);
  (alignment->SupportData).BlockLength = local_34;
  uVar31 = local_34;
  if (this->m_isBigEndian == true) {
    uVar31 = local_34 >> 0x18 | (local_34 & 0xff0000) >> 8 | (local_34 & 0xff00) << 8 |
             local_34 << 0x18;
    (alignment->SupportData).BlockLength = uVar31;
  }
  if ((uVar31 != 0) && (sVar33 = BgzfStream::Read(this_00,(char *)&local_58,0x20), sVar33 == 0x20))
  {
    if (this->m_isBigEndian == true) {
      lVar34 = 0;
      do {
        auVar36 = *(undefined1 (*) [16])((long)&local_58 + lVar34 * 4);
        auVar37[1] = 0;
        auVar37[0] = auVar36[8];
        auVar37[2] = auVar36[9];
        auVar37[3] = 0;
        auVar37[4] = auVar36[10];
        auVar37[5] = 0;
        auVar37[6] = auVar36[0xb];
        auVar37[7] = 0;
        auVar37[8] = auVar36[0xc];
        auVar37[9] = 0;
        auVar37[10] = auVar36[0xd];
        auVar37[0xb] = 0;
        auVar37[0xc] = auVar36[0xe];
        auVar37[0xd] = 0;
        auVar37[0xe] = auVar36[0xf];
        auVar37[0xf] = 0;
        auVar37 = pshuflw(auVar37,auVar37,0x1b);
        auVar37 = pshufhw(auVar37,auVar37,0x1b);
        auVar20[0xd] = 0;
        auVar20._0_13_ = auVar36._0_13_;
        auVar20[0xe] = auVar36[7];
        auVar21[0xc] = auVar36[6];
        auVar21._0_12_ = auVar36._0_12_;
        auVar21._13_2_ = auVar20._13_2_;
        auVar22[0xb] = 0;
        auVar22._0_11_ = auVar36._0_11_;
        auVar22._12_3_ = auVar21._12_3_;
        auVar23[10] = auVar36[5];
        auVar23._0_10_ = auVar36._0_10_;
        auVar23._11_4_ = auVar22._11_4_;
        auVar24[9] = 0;
        auVar24._0_9_ = auVar36._0_9_;
        auVar24._10_5_ = auVar23._10_5_;
        auVar25[8] = auVar36[4];
        auVar25._0_8_ = auVar36._0_8_;
        auVar25._9_6_ = auVar24._9_6_;
        auVar28._7_8_ = 0;
        auVar28._0_7_ = auVar25._8_7_;
        auVar29._1_8_ = SUB158(auVar28 << 0x40,7);
        auVar29[0] = auVar36[3];
        auVar29._9_6_ = 0;
        auVar30._1_10_ = SUB1510(auVar29 << 0x30,5);
        auVar30[0] = auVar36[2];
        auVar30._11_4_ = 0;
        auVar26[2] = auVar36[1];
        auVar26._0_2_ = auVar36._0_2_;
        auVar26._3_12_ = SUB1512(auVar30 << 0x20,3);
        auVar36._0_2_ = auVar36._0_2_ & 0xff;
        auVar36._2_13_ = auVar26._2_13_;
        auVar36[0xf] = 0;
        auVar36 = pshuflw(auVar36,auVar36,0x1b);
        auVar36 = pshufhw(auVar36,auVar36,0x1b);
        sVar4 = auVar36._0_2_;
        sVar5 = auVar36._2_2_;
        sVar6 = auVar36._4_2_;
        sVar7 = auVar36._6_2_;
        sVar8 = auVar36._8_2_;
        sVar9 = auVar36._10_2_;
        sVar10 = auVar36._12_2_;
        sVar11 = auVar36._14_2_;
        sVar12 = auVar37._0_2_;
        sVar13 = auVar37._2_2_;
        sVar14 = auVar37._4_2_;
        sVar15 = auVar37._6_2_;
        sVar16 = auVar37._8_2_;
        sVar17 = auVar37._10_2_;
        sVar18 = auVar37._12_2_;
        sVar19 = auVar37._14_2_;
        lVar2 = lVar34 * 4;
        *(char *)((long)&local_58 + lVar2) =
             (0 < sVar4) * (sVar4 < 0x100) * auVar36[0] - (0xff < sVar4);
        *(char *)((long)&local_58 + lVar2 + 1) =
             (0 < sVar5) * (sVar5 < 0x100) * auVar36[2] - (0xff < sVar5);
        *(char *)((long)&local_58 + lVar2 + 2) =
             (0 < sVar6) * (sVar6 < 0x100) * auVar36[4] - (0xff < sVar6);
        *(char *)((long)&local_58 + lVar2 + 3) =
             (0 < sVar7) * (sVar7 < 0x100) * auVar36[6] - (0xff < sVar7);
        *(char *)((long)&local_58 + lVar2 + 4) =
             (0 < sVar8) * (sVar8 < 0x100) * auVar36[8] - (0xff < sVar8);
        *(char *)((long)&local_58 + lVar2 + 5) =
             (0 < sVar9) * (sVar9 < 0x100) * auVar36[10] - (0xff < sVar9);
        *(char *)((long)&local_58 + lVar2 + 6) =
             (0 < sVar10) * (sVar10 < 0x100) * auVar36[0xc] - (0xff < sVar10);
        *(char *)((long)&local_58 + lVar2 + 7) =
             (0 < sVar11) * (sVar11 < 0x100) * auVar36[0xe] - (0xff < sVar11);
        *(char *)(&local_50 + lVar34) =
             (0 < sVar12) * (sVar12 < 0x100) * auVar37[0] - (0xff < sVar12);
        *(char *)((long)&local_50 + lVar2 + 1) =
             (0 < sVar13) * (sVar13 < 0x100) * auVar37[2] - (0xff < sVar13);
        *(char *)((long)&local_50 + lVar2 + 2) =
             (0 < sVar14) * (sVar14 < 0x100) * auVar37[4] - (0xff < sVar14);
        *(char *)((long)&local_50 + lVar2 + 3) =
             (0 < sVar15) * (sVar15 < 0x100) * auVar37[6] - (0xff < sVar15);
        *(char *)(&local_4c + lVar34) =
             (0 < sVar16) * (sVar16 < 0x100) * auVar37[8] - (0xff < sVar16);
        *(char *)((long)&local_4c + lVar2 + 1) =
             (0 < sVar17) * (sVar17 < 0x100) * auVar37[10] - (0xff < sVar17);
        *(char *)((long)&local_4c + lVar2 + 2) =
             (0 < sVar18) * (sVar18 < 0x100) * auVar37[0xc] - (0xff < sVar18);
        *(char *)((long)&local_4c + lVar2 + 3) =
             (0 < sVar19) * (sVar19 < 0x100) * auVar37[0xe] - (0xff < sVar19);
        lVar34 = lVar34 + 4;
      } while (lVar34 != 8);
    }
    alignment->RefID = (undefined4)local_58;
    alignment->Position = local_58._4_4_;
    alignment->Bin = (uint16_t)(local_50 >> 0x10);
    alignment->MapQuality = (ushort)(local_50 >> 8) & 0xff;
    (alignment->SupportData).QueryNameLength = local_50 & 0xff;
    alignment->AlignmentFlag = local_4c >> 0x10;
    (alignment->SupportData).NumCigarOperations = local_4c & 0xffff;
    (alignment->SupportData).QuerySequenceLength = local_48;
    alignment->MateRefID = (undefined4)local_44;
    alignment->MatePosition = local_44._4_4_;
    alignment->InsertSize = local_3c;
    alignment->Length = local_48;
    __n = (ulong)((alignment->SupportData).BlockLength - 0x20);
    data = (char *)operator_new__(__n);
    memset(data,0,__n);
    sVar33 = BgzfStream::Read(this_00,data,__n);
    uVar35 = CONCAT71((int7)((ulong)unaff_RBP >> 8),sVar33 == __n);
    if (sVar33 == __n) {
      std::__cxx11::string::_M_replace
                ((ulong)&alignment->SupportData,0,
                 (char *)(alignment->SupportData).AllCharData._M_string_length,(ulong)data);
      pCVar3 = (alignment->CigarData).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((alignment->CigarData).
          super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
          super__Vector_impl_data._M_finish != pCVar3) {
        (alignment->CigarData).
        super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
        super__Vector_impl_data._M_finish = pCVar3;
      }
      local_5c = (uint)uVar35;
      uVar31 = (alignment->SupportData).QueryNameLength;
      std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::reserve
                (&alignment->CigarData,(ulong)(alignment->SupportData).NumCigarOperations);
      if ((alignment->SupportData).NumCigarOperations != 0) {
        uVar35 = 0;
        do {
          uVar32 = *(uint *)(data + uVar35 * 4 + (ulong)uVar31);
          if (this->m_isBigEndian == true) {
            uVar32 = uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 | (uVar32 & 0xff00) << 8 |
                     uVar32 << 0x18;
            *(uint *)(data + uVar35 * 4 + (ulong)uVar31) = uVar32;
          }
          local_68.Length = uVar32 >> 4;
          local_68.Type = "MIDNSHP=X"[uVar32 & 0xf];
          __position._M_current =
               (alignment->CigarData).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (alignment->CigarData).
              super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<BamTools::CigarOp,std::allocator<BamTools::CigarOp>>::
            _M_realloc_insert<BamTools::CigarOp_const&>
                      ((vector<BamTools::CigarOp,std::allocator<BamTools::CigarOp>> *)
                       &alignment->CigarData,__position,&local_68);
          }
          else {
            CVar27.Length = local_68.Length;
            CVar27.Type = "MIDNSHP=X"[uVar32 & 0xf];
            CVar27._1_3_ = local_68._1_3_;
            *__position._M_current = CVar27;
            ppCVar1 = &(alignment->CigarData).
                       super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppCVar1 = *ppCVar1 + 1;
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 < (alignment->SupportData).NumCigarOperations);
      }
      uVar35 = (ulong)local_5c;
    }
    operator_delete__(data);
    return (bool)(char)uVar35;
  }
  return false;
}

Assistant:

bool BamReaderPrivate::LoadNextAlignment(BamAlignment& alignment) {

    // read in the 'block length' value, make sure it's not zero
    char buffer[sizeof(uint32_t)];
    fill_n(buffer, sizeof(uint32_t), 0);
    m_stream.Read(buffer, sizeof(uint32_t));
    alignment.SupportData.BlockLength = BamTools::UnpackUnsignedInt(buffer);
    if ( m_isBigEndian ) BamTools::SwapEndian_32(alignment.SupportData.BlockLength);
    if ( alignment.SupportData.BlockLength == 0 )
        return false;

    // read in core alignment data, make sure the right size of data was read
    char x[Constants::BAM_CORE_SIZE];
    if ( m_stream.Read(x, Constants::BAM_CORE_SIZE) != Constants::BAM_CORE_SIZE )
        return false;

    // swap core endian-ness if necessary
    if ( m_isBigEndian ) {
        for ( unsigned int i = 0; i < Constants::BAM_CORE_SIZE; i+=sizeof(uint32_t) )
            BamTools::SwapEndian_32p(&x[i]);
    }

    // set BamAlignment 'core' and 'support' data
    alignment.RefID    = BamTools::UnpackSignedInt(&x[0]);
    alignment.Position = BamTools::UnpackSignedInt(&x[4]);

    unsigned int tempValue = BamTools::UnpackUnsignedInt(&x[8]);
    alignment.Bin        = tempValue >> 16;
    alignment.MapQuality = tempValue >> 8 & 0xff;
    alignment.SupportData.QueryNameLength = tempValue & 0xff;

    tempValue = BamTools::UnpackUnsignedInt(&x[12]);
    alignment.AlignmentFlag = tempValue >> 16;
    alignment.SupportData.NumCigarOperations = tempValue & 0xffff;

    alignment.SupportData.QuerySequenceLength = BamTools::UnpackUnsignedInt(&x[16]);
    alignment.MateRefID    = BamTools::UnpackSignedInt(&x[20]);
    alignment.MatePosition = BamTools::UnpackSignedInt(&x[24]);
    alignment.InsertSize   = BamTools::UnpackSignedInt(&x[28]);

    // set BamAlignment length
    alignment.Length = alignment.SupportData.QuerySequenceLength;

    // read in character data - make sure proper data size was read
    bool readCharDataOK = false;
    const unsigned int dataLength = alignment.SupportData.BlockLength - Constants::BAM_CORE_SIZE;
    RaiiBuffer allCharData(dataLength);

    if ( m_stream.Read(allCharData.Buffer, dataLength) == dataLength ) {

        // store 'allCharData' in supportData structure
        alignment.SupportData.AllCharData.assign((const char*)allCharData.Buffer, dataLength);

        // set success flag
        readCharDataOK = true;

        // save CIGAR ops
        // need to calculate this here so that  BamAlignment::GetEndPosition() performs correctly,
        // even when GetNextAlignmentCore() is called
        const unsigned int cigarDataOffset = alignment.SupportData.QueryNameLength;
        uint32_t* cigarData = (uint32_t*)(allCharData.Buffer + cigarDataOffset);
        CigarOp op;
        alignment.CigarData.clear();
        alignment.CigarData.reserve(alignment.SupportData.NumCigarOperations);
        for ( unsigned int i = 0; i < alignment.SupportData.NumCigarOperations; ++i ) {

            // swap endian-ness if necessary
            if ( m_isBigEndian ) BamTools::SwapEndian_32(cigarData[i]);

            // build CigarOp structure
            op.Length = (cigarData[i] >> Constants::BAM_CIGAR_SHIFT);
            op.Type   = Constants::BAM_CIGAR_LOOKUP[ (cigarData[i] & Constants::BAM_CIGAR_MASK) ];

            // save CigarOp
            alignment.CigarData.push_back(op);
        }
    }

    // return success/failure
    return readCharDataOK;
}